

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_client_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  void *__src;
  ptls_key_exchange_context_t **pppVar1;
  ushort *puVar2;
  byte *pbVar3;
  char cVar4;
  uint8_t uVar5;
  st_ptls_get_time_t *psVar6;
  st_ptls_on_extension_t *psVar7;
  st_ptls_decompress_certificate_t *psVar8;
  ptls_buffer_t *buf;
  size_t sVar9;
  st_ptls_save_ticket_t *psVar10;
  ptls_key_exchange_context_t *ppVar11;
  st_ptls_aead_context_t *__ptr;
  ptls_key_exchange_algorithm_t *ppVar12;
  st_ptls_update_traffic_key_t *psVar13;
  ptls_iovec_t pVar14;
  ptls_iovec_t nonce;
  byte bVar15;
  ushort uVar16;
  ushort uVar17;
  int iVar18;
  int iVar19;
  uint64_t uVar20;
  uint8_t *puVar21;
  ptls_key_exchange_algorithm_t **pppVar22;
  uint8_t *puVar23;
  uint uVar24;
  ptls_cipher_suite_t **pppVar25;
  ptls_message_emitter_t *emitter_00;
  ptls_cipher_suite_t *ppVar26;
  ulong uVar27;
  bool bVar28;
  ptls_key_schedule_t *ppVar29;
  size_t sVar30;
  ushort *puVar31;
  uint8_t *puVar32;
  long lVar33;
  uint8_t *puVar34;
  ptls_hash_context_t **pppVar35;
  ushort *puVar36;
  size_t sVar37;
  ushort uVar38;
  uint8_t *puVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ptls_iovec_t pVar43;
  ptls_iovec_t context;
  ptls_iovec_t pVar44;
  ptls_iovec_t pVar45;
  ptls_iovec_t pVar46;
  ptls_iovec_t pVar47;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar48;
  ptls_message_emitter_t *_emitter;
  uint32_t ticket_lifetime;
  ptls_iovec_t ticket_nonce;
  uint32_t max_early_data_size;
  uint32_t ticket_age_add;
  ptls_raw_extension_t unknown_extensions [17];
  ushort local_2d2;
  ushort local_2ba;
  uint8_t *local_2b8;
  ptls_buffer_t local_2a8;
  uint8_t *local_280;
  uint8_t *local_278;
  uint8_t *local_270;
  ulong local_268;
  ptls_iovec_t local_260;
  void *local_250;
  uint8_t *local_248;
  uint32_t local_240;
  uint32_t local_23c;
  undefined1 local_238 [24];
  undefined8 uStack_220;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  uint8_t *puStack_200;
  ptls_iovec_t local_1f8 [28];
  
  puVar23 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar24 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xd < uVar24) {
switchD_00117309_caseD_8:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                  ,0x1160,
                  "int handle_client_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar4 = *(char *)&emitter_00->buf;
  message_00.len =
       (long)&switchD_00117309::switchdataD_0012a510 +
       (long)(int)(&switchD_00117309::switchdataD_0012a510)[uVar24];
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    if (is_end_of_record == 0 || cVar4 != '\x02') {
      return 10;
    }
    local_2a8.base = (uint8_t *)0x0;
    local_2a8.capacity = 0;
    local_238._0_8_ = (uint8_t *)0x0;
    local_238._8_8_ = 0;
    stack0xfffffffffffffdd8 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_1f8[0].base = (uint8_t *)0x0;
    if ((long)puVar23 < 0x26) {
      return 0x32;
    }
    auVar41[0] = -(*(char *)((long)&emitter_00->record_header_length + 6) == -0x3e);
    auVar41[1] = -(*(char *)((long)&emitter_00->record_header_length + 7) == -0x5e);
    auVar41[2] = -(*(char *)&emitter_00->begin_message == '\x11');
    auVar41[3] = -(*(char *)((long)&emitter_00->begin_message + 1) == '\x16');
    auVar41[4] = -(*(char *)((long)&emitter_00->begin_message + 2) == 'z');
    auVar41[5] = -(*(char *)((long)&emitter_00->begin_message + 3) == -0x45);
    auVar41[6] = -(*(char *)((long)&emitter_00->begin_message + 4) == -0x74);
    auVar41[7] = -(*(char *)((long)&emitter_00->begin_message + 5) == '^');
    auVar41[8] = -(*(char *)((long)&emitter_00->begin_message + 6) == '\a');
    auVar41[9] = -(*(char *)((long)&emitter_00->begin_message + 7) == -0x62);
    auVar41[10] = -(*(char *)&emitter_00->commit_message == '\t');
    auVar41[0xb] = -(*(char *)((long)&emitter_00->commit_message + 1) == -0x1e);
    auVar41[0xc] = -(*(char *)((long)&emitter_00->commit_message + 2) == -0x38);
    auVar41[0xd] = -(*(char *)((long)&emitter_00->commit_message + 3) == -0x58);
    auVar41[0xe] = -(*(char *)((long)&emitter_00->commit_message + 4) == '3');
    auVar41[0xf] = -(*(char *)((long)&emitter_00->commit_message + 5) == -100);
    auVar40[0] = -(*(char *)((long)&emitter_00->buf + 6) == -0x31);
    auVar40[1] = -(*(char *)((long)&emitter_00->buf + 7) == '!');
    auVar40[2] = -(*(char *)&emitter_00->enc == -0x53);
    auVar40[3] = -(*(char *)((long)&emitter_00->enc + 1) == 't');
    auVar40[4] = -(*(char *)((long)&emitter_00->enc + 2) == -0x1b);
    auVar40[5] = -(*(char *)((long)&emitter_00->enc + 3) == -0x66);
    auVar40[6] = -(*(char *)((long)&emitter_00->enc + 4) == 'a');
    auVar40[7] = -(*(char *)((long)&emitter_00->enc + 5) == '\x11');
    auVar40[8] = -(*(char *)((long)&emitter_00->enc + 6) == -0x42);
    auVar40[9] = -(*(char *)((long)&emitter_00->enc + 7) == '\x1d');
    auVar40[10] = -((char)emitter_00->record_header_length == -0x74);
    auVar40[0xb] = -(*(char *)((long)&emitter_00->record_header_length + 1) == '\x02');
    auVar40[0xc] = -(*(char *)((long)&emitter_00->record_header_length + 2) == '\x1e');
    auVar40[0xd] = -(*(char *)((long)&emitter_00->record_header_length + 3) == 'e');
    auVar40[0xe] = -(*(char *)((long)&emitter_00->record_header_length + 4) == -0x48);
    auVar40[0xf] = -(*(char *)((long)&emitter_00->record_header_length + 5) == -0x6f);
    auVar40 = auVar40 & auVar41;
    local_208[0] = (ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff;
    bVar28 = !(bool)local_208[0];
    local_208._1_3_ = 0;
    stack0xfffffffffffffdfc = SUB1612((undefined1  [16])0x0,4);
    iVar18 = 0x32;
    if (puVar23 != (uint8_t *)0x26) {
      bVar15 = *(byte *)((long)&emitter_00->commit_message + 6);
      puVar39 = (uint8_t *)(ulong)bVar15;
      if (puVar39 <= puVar23 + -0x27 && puVar39 < (uint8_t *)0x21) {
        puVar21 = (uint8_t *)((long)&emitter_00->buf + (long)puVar23);
        local_218._0_8_ = (long)&emitter_00->commit_message + 7;
        puVar32 = (uint8_t *)((long)&emitter_00->buf + (long)puVar39);
        local_218[8] = bVar15;
        local_218._9_7_ = 0;
        if (1 < (long)puVar21 - (long)(puVar32 + 0x27)) {
          pppVar25 = tls->ctx->cipher_suites;
          ppVar26 = *pppVar25;
          if (ppVar26 != (ptls_cipher_suite_t *)0x0) {
            uVar17 = *(ushort *)(puVar32 + 0x27);
            do {
              pppVar25 = pppVar25 + 1;
              if (ppVar26->id == (uint16_t)(uVar17 << 8 | uVar17 >> 8)) {
                tls->cipher_suite = ppVar26;
                if ((puVar32 + 0x29 == puVar21) || (puVar32[0x29] != '\0')) goto LAB_0011744a;
                if (bVar28) {
                  local_2b8 = (uint8_t *)0x0;
                }
                else {
                  puStack_200._0_2_ = 0xffff;
                  puStack_200._2_6_ = 0;
                  local_2b8 = (uint8_t *)0xffff;
                }
                local_260.base = (uint8_t *)0x240000012421;
                if ((ulong)((long)puVar21 - (long)(puVar32 + 0x2a)) < 2) goto LAB_0011834a;
                uVar27 = (ulong)(ushort)(*(ushort *)(puVar32 + 0x2a) << 8 |
                                        *(ushort *)(puVar32 + 0x2a) >> 8);
                puVar32 = puVar32 + 0x2c;
                if ((ulong)((long)puVar21 - (long)puVar32) < uVar27) goto LAB_0011834a;
                local_2ba = 0xffff;
                local_268 = 0;
                local_280 = (uint8_t *)0x0;
                local_2d2 = 0xffff;
                local_250 = (void *)local_218._0_8_;
                local_248 = puVar32 + uVar27;
                local_270 = puVar39;
                goto LAB_001183f4;
              }
              ppVar26 = *pppVar25;
            } while (ppVar26 != (ptls_cipher_suite_t *)0x0);
          }
          tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
LAB_0011744a:
          iVar18 = 0x2f;
        }
      }
    }
    goto LAB_00117450;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (cVar4 != '\b') {
      return 10;
    }
    local_238._0_2_ = 0xffff;
    local_2a8.base = (uint8_t *)0x83a0000002020;
    if ((((ulong)puVar23 & 0xfffffffffffffffe) == 4) ||
       (uVar17 = *(ushort *)((long)&emitter_00->buf + 4),
       puVar39 = (uint8_t *)(ulong)(ushort)(uVar17 << 8 | uVar17 >> 8), puVar23 + -6 < puVar39)) {
      return 0x32;
    }
    puVar21 = (uint8_t *)((long)&emitter_00->buf + 6);
    if (puVar39 == (uint8_t *)0x0) {
      bVar28 = false;
      puVar32 = (uint8_t *)0x0;
    }
    else {
      puVar39 = puVar39 + (long)puVar21;
      bVar28 = true;
      puVar32 = (uint8_t *)0x0;
      do {
        if ((long)puVar39 - (long)puVar21 < 2) {
          return 0x32;
        }
        uVar5 = *puVar21;
        bVar15 = puVar21[1];
        uVar17 = CONCAT11(uVar5,bVar15);
        if (uVar17 < 0x40) {
          if ((*(byte *)((long)&((ptls_iovec_t *)&local_2a8)->base + (ulong)(uVar17 >> 3)) >>
               (uVar17 & 7) & 1) != 0) {
            return 0x2f;
          }
          pbVar3 = (byte *)((long)&((ptls_iovec_t *)&local_2a8)->base + (ulong)(bVar15 >> 3));
          *pbVar3 = *pbVar3 | '\x01' << (bVar15 & 7);
        }
        if ((ulong)((long)puVar39 - (long)(puVar21 + 2)) < 2) {
          return 0x32;
        }
        uVar17 = *(ushort *)(puVar21 + 2) << 8 | *(ushort *)(puVar21 + 2) >> 8;
        uVar27 = (ulong)uVar17;
        pVar47.base = puVar21 + 4;
        if ((ulong)((long)puVar39 - (long)pVar47.base) < uVar27) {
          return 0x32;
        }
        psVar7 = tls->ctx->on_extension;
        uVar38 = CONCAT11(uVar5,bVar15);
        if ((psVar7 != (st_ptls_on_extension_t *)0x0) &&
           (pVar46.len._0_2_ = uVar17, pVar46.base = pVar47.base, pVar46.len._2_6_ = 0,
           iVar18 = (*psVar7->cb)(psVar7,tls,'\b',uVar38,pVar46), iVar18 != 0)) {
          return 1;
        }
        puVar34 = puVar21 + uVar27 + 4;
        if (uVar38 < 0x2a) {
          if (uVar38 == 0) {
            if (uVar27 != 0) {
              return 0x32;
            }
            if (tls->server_name == (char *)0x0) {
              return 0x2f;
            }
            iVar18 = ptls_server_name_is_ipaddr(tls->server_name);
            if (iVar18 != 0) {
              return 0x2f;
            }
          }
          else if (uVar38 == 0x10) {
            if (uVar17 < 2) {
              return 0x32;
            }
            uVar27 = (ulong)(ushort)(*(ushort *)(puVar21 + 4) << 8 | *(ushort *)(puVar21 + 4) >> 8);
            if ((ulong)((long)puVar34 - (long)(puVar21 + 6)) < uVar27) {
              return 0x32;
            }
            if (uVar27 == 0) {
              return 0x32;
            }
            pVar47.base = puVar21 + 6 + uVar27;
            uVar27 = (ulong)puVar21[6];
            puVar21 = puVar21 + 7;
            if ((ulong)((long)pVar47.base - (long)puVar21) < uVar27) {
              return 0x32;
            }
            if (uVar27 == 0) {
              return 0x32;
            }
            local_278 = puVar34;
            iVar18 = ptls_set_negotiated_protocol(tls,(char *)puVar21,uVar27);
            if (iVar18 != 0) {
              return iVar18;
            }
            if (puVar21 + uVar27 != pVar47.base) {
              return 0x28;
            }
            puVar34 = local_278;
            if (pVar47.base != local_278) {
              return 0x32;
            }
          }
          else {
LAB_00117d15:
            handle_unknown_extension
                      (tls,properties,uVar38,pVar47.base,puVar34,(ptls_raw_extension_t *)local_238);
          }
        }
        else if (uVar38 == 0x2a) {
          bVar28 = false;
          if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
            return 0x2f;
          }
        }
        else {
          if (uVar38 != 0xffce) goto LAB_00117d15;
          if (*pVar47.base != '\0') {
            return 0x208;
          }
          if (uVar17 != 0x11) {
            return 0x2f;
          }
          puVar32 = puVar21 + 5;
        }
        puVar21 = puVar34;
      } while (puVar34 != puVar39);
      bVar28 = !bVar28;
      puVar21 = puVar39;
    }
    if (puVar21 != (uint8_t *)((long)&emitter_00->buf + (long)puVar23)) {
      return 0x32;
    }
    if (tls->esni == (ptls_esni_secret_t *)0x0) {
      if (puVar32 != (uint8_t *)0x0) {
        return 0x2f;
      }
    }
    else {
      if (puVar32 == (uint8_t *)0x0) {
        return 0x2f;
      }
      iVar18 = (*ptls_mem_equal)(puVar32,tls->esni->nonce,0x10);
      if (iVar18 == 0) {
        return 0x2f;
      }
      free_esni_secret(&tls->esni,0);
    }
    bVar15 = (tls->field_18).server.pending_traffic_secret[0x38];
    if ((bVar15 & 2) != 0) {
      if (bVar28 == false) {
        (tls->field_18).server.pending_traffic_secret[0x38] = bVar15 & 0xfd;
      }
      if (properties != (ptls_handshake_properties_t *)0x0) {
        (properties->field_0).client.early_data_acceptance = bVar28 + PTLS_EARLY_DATA_REJECTED;
      }
    }
    iVar18 = report_unknown_extensions(tls,properties,(ptls_raw_extension_t *)local_238);
    if (iVar18 == 0) {
      ppVar29 = tls->key_schedule;
      if (ppVar29->num_hashes != 0) {
        pppVar35 = &ppVar29->hashes[0].ctx;
        sVar30 = 0;
        do {
          (*(*pppVar35)->update)(*pppVar35,emitter_00,(size_t)puVar23);
          sVar30 = sVar30 + 1;
          pppVar35 = pppVar35 + 2;
        } while (sVar30 != ppVar29->num_hashes);
      }
      bVar15 = (tls->field_0x160 & 2) >> 1;
      tls->state = (uint)bVar15 + (uint)bVar15 * 2 +
                   PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
      return 0x202;
    }
    return iVar18;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (cVar4 == '\v') {
LAB_00117a69:
      iVar19 = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                                  (uint8_t *)((long)&emitter_00->buf + (long)puVar23),
                                  (int *)local_238);
      iVar18 = 0x2f;
      if (local_238._0_4_ != 0) {
        iVar18 = 0;
      }
      if (iVar19 != 0) {
        iVar18 = iVar19;
      }
      if (iVar18 == 0) {
        ppVar29 = tls->key_schedule;
        if (ppVar29->num_hashes != 0) {
          pppVar35 = &ppVar29->hashes[0].ctx;
          sVar30 = 0;
          do {
            (*(*pppVar35)->update)(*pppVar35,emitter_00,(size_t)puVar23);
            sVar30 = sVar30 + 1;
            pppVar35 = pppVar35 + 2;
          } while (sVar30 != ppVar29->num_hashes);
        }
        tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
        return 0x202;
      }
      return iVar18;
    }
    if (cVar4 != '\x19') {
      if (cVar4 != '\r') {
        return 10;
      }
      if (puVar23 == (uint8_t *)0x4) {
        return 0x32;
      }
      puVar39 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->buf + 4);
      if (puVar23 + -5 < puVar39) {
        return 0x32;
      }
      puVar21 = (uint8_t *)0x1;
      if (puVar39 != (uint8_t *)0x0) {
        puVar21 = puVar39;
      }
      puVar21 = (uint8_t *)malloc((size_t)puVar21);
      (tls->field_18).client.certificate_request.context.base = puVar21;
      if (puVar21 == (uint8_t *)0x0) {
        return 0x201;
      }
      puVar2 = (ushort *)((long)&emitter_00->buf + (long)puVar23);
      __src = (void *)((long)&emitter_00->buf + 5);
      puVar36 = (ushort *)((long)__src + (long)puVar39);
      (tls->field_18).client.certificate_request.context.len = (size_t)puVar39;
      memcpy(puVar21,__src,(size_t)puVar39);
      local_2a8.base = (uint8_t *)0x83e0000010401;
      if ((ulong)((long)puVar2 - (long)puVar36) < 2) {
        return 0x32;
      }
      uVar27 = (ulong)(ushort)(*puVar36 << 8 | *puVar36 >> 8);
      puVar36 = puVar36 + 1;
      if ((ulong)((long)puVar2 - (long)puVar36) < uVar27) {
        return 0x32;
      }
      puVar31 = puVar36;
      if (uVar27 != 0) {
        puVar31 = (ushort *)(uVar27 + (long)puVar36);
        do {
          if ((long)puVar31 - (long)puVar36 < 2) {
            return 0x32;
          }
          uVar38 = *puVar36;
          bVar15 = *(byte *)((long)puVar36 + 1);
          uVar17 = CONCAT11((char)uVar38,bVar15);
          if (uVar17 < 0x40) {
            if ((*(byte *)((long)&((ptls_iovec_t *)&local_2a8)->base + (ulong)(uVar17 >> 3)) >>
                 (uVar17 & 7) & 1) != 0) {
              return 0x2f;
            }
            pbVar3 = (byte *)((long)&((ptls_iovec_t *)&local_2a8)->base + (ulong)(bVar15 >> 3));
            *pbVar3 = *pbVar3 | '\x01' << (bVar15 & 7);
          }
          if ((ulong)((long)puVar31 - (long)(puVar36 + 1)) < 2) {
            return 0x32;
          }
          uVar16 = puVar36[1] << 8 | puVar36[1] >> 8;
          puVar36 = puVar36 + 2;
          if ((ulong)((long)puVar31 - (long)puVar36) < (ulong)uVar16) {
            return 0x32;
          }
          psVar7 = tls->ctx->on_extension;
          local_238._0_8_ = puVar36;
          if ((psVar7 != (st_ptls_on_extension_t *)0x0) &&
             (pVar45.len._0_2_ = uVar16, pVar45.base = (uint8_t *)puVar36, pVar45.len._2_6_ = 0,
             iVar18 = (*psVar7->cb)(psVar7,tls,'\r',CONCAT11((char)uVar38,bVar15),pVar45),
             iVar18 != 0)) {
            return 1;
          }
          puVar36 = (ushort *)((long)puVar36 + (ulong)uVar16);
          if ((uVar17 == 0xd) &&
             (iVar18 = decode_signature_algorithms
                                 (&(tls->field_18).client.certificate_request.signature_algorithms,
                                  (uint8_t **)local_238,(uint8_t *)puVar36), iVar18 != 0)) {
            return iVar18;
          }
          local_238._0_8_ = puVar36;
        } while (puVar36 != puVar31);
      }
      if (puVar31 != puVar2) {
        return 0x32;
      }
      if ((tls->field_18).client.certificate_request.signature_algorithms.count == 0) {
        return 0x6d;
      }
      if ((tls->field_18).client.certificate_request.context.len != 0) {
        return 0x2f;
      }
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
      ppVar29 = tls->key_schedule;
      if (ppVar29->num_hashes != 0) {
        pppVar35 = &ppVar29->hashes[0].ctx;
        sVar30 = 0;
        do {
          (*(*pppVar35)->update)(*pppVar35,emitter_00,(size_t)puVar23);
          sVar30 = sVar30 + 1;
          pppVar35 = pppVar35 + 2;
        } while (sVar30 != ppVar29->num_hashes);
        return 0x202;
      }
      return 0x202;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar4 != '\x19') {
      if (cVar4 != '\v') {
        return 10;
      }
      goto LAB_00117a69;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar4 != '\x0f') {
      return 10;
    }
    iVar18 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar18 == 0) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
      return 0x202;
    }
    return iVar18;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (is_end_of_record == 0 || cVar4 != '\x14') {
      return 10;
    }
    iVar18 = verify_finished(tls,message);
    if (iVar18 == 0) {
      ppVar29 = tls->key_schedule;
      if (ppVar29->num_hashes != 0) {
        pppVar35 = &ppVar29->hashes[0].ctx;
        sVar30 = 0;
        do {
          (*(*pppVar35)->update)(*pppVar35,emitter_00,(size_t)puVar23);
          sVar30 = sVar30 + 1;
          pppVar35 = pppVar35 + 2;
        } while (sVar30 != ppVar29->num_hashes);
        ppVar29 = tls->key_schedule;
      }
      iVar18 = key_schedule_extract(ppVar29,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar18 == 0) &&
           (iVar18 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar18 == 0)) &&
          (iVar18 = derive_secret(tls->key_schedule,local_238,"c ap traffic"), iVar18 == 0)) &&
         (iVar18 = derive_exporter_secret(tls,0), iVar18 == 0)) {
        if (tls->pending_handshake_secret != (uint8_t *)0x0) {
          if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
             (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                          ,0xb51,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          bVar15 = (tls->field_18).server.pending_traffic_secret[0x38];
          if (((bVar15 & 2) != 0) && ((tls->ctx->field_0x70 & 0x10) == 0)) {
            iVar18 = (*emitter->begin_message)(emitter);
            if (iVar18 != 0) goto LAB_001179f1;
            buf = emitter->buf;
            ppVar29 = tls->key_schedule;
            sVar30 = buf->off;
            iVar18 = ptls_buffer_reserve(buf,1);
            if (iVar18 != 0) goto LAB_001179f1;
            buf->base[buf->off] = '\x05';
            buf->off = buf->off + 1;
            iVar18 = ptls_buffer_reserve(buf,3);
            if (iVar18 != 0) goto LAB_001179f1;
            puVar23 = buf->base;
            sVar9 = buf->off;
            puVar23[sVar9 + 2] = '\0';
            puVar23 = puVar23 + sVar9;
            puVar23[0] = '\0';
            puVar23[1] = '\0';
            sVar9 = buf->off;
            buf->off = sVar9 + 3;
            lVar33 = -3;
            do {
              buf->base[lVar33 + 3 + sVar9] = '\0';
              lVar33 = lVar33 + 1;
            } while (lVar33 != 0);
            if ((ppVar29 != (ptls_key_schedule_t *)0x0) && (ppVar29->num_hashes != 0)) {
              puVar23 = buf->base;
              sVar9 = buf->off;
              pppVar35 = &ppVar29->hashes[0].ctx;
              sVar37 = 0;
              do {
                (*(*pppVar35)->update)(*pppVar35,puVar23 + sVar30,sVar9 - sVar30);
                sVar37 = sVar37 + 1;
                pppVar35 = pppVar35 + 2;
              } while (sVar37 != ppVar29->num_hashes);
            }
            iVar18 = (*emitter->commit_message)(emitter);
            if (iVar18 != 0) goto LAB_001179f1;
            bVar15 = (tls->field_18).server.pending_traffic_secret[0x38];
          }
          (tls->field_18).server.pending_traffic_secret[0x38] = bVar15 & 0xfd;
          iVar18 = commission_handshake_secret(tls);
          if (iVar18 != 0) goto LAB_001179f1;
        }
        iVar18 = push_change_cipher_spec(tls,emitter);
        if (iVar18 == 0) {
          puVar23 = (tls->field_18).client.certificate_request.context.base;
          if (puVar23 != (uint8_t *)0x0) {
            iVar18 = 0x2f;
            if ((tls->field_0x160 & 2) != 0) goto LAB_001179f1;
            context.len = (tls->field_18).client.certificate_request.context.len;
            context.base = puVar23;
            iVar18 = send_certificate_and_certificate_verify
                               (tls,emitter,
                                &(tls->field_18).client.certificate_request.signature_algorithms,
                                context,"TLS 1.3, client CertificateVerify",0,(uint16_t *)0x0,0);
            free((tls->field_18).client.certificate_request.context.base);
            *(uint8_t **)((long)&tls->field_18 + 0x40) = (uint8_t *)0x0;
            *(size_t *)((long)&tls->field_18 + 0x48) = 0;
            if (iVar18 != 0) goto LAB_001179f1;
          }
          send_finished(tls,emitter);
          *(undefined8 *)(tls->traffic_protection).enc.secret = local_238._0_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = local_238._8_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = local_238._16_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = uStack_220;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x20) = local_218._0_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x28) = local_218._8_8_;
          *(undefined1 (*) [8])((tls->traffic_protection).enc.secret + 0x30) = local_208;
          *(uint8_t **)((tls->traffic_protection).enc.secret + 0x38) = puStack_200;
          iVar18 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
          if (iVar18 == 0) {
            tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
            iVar18 = 0;
          }
        }
      }
    }
LAB_001179f1:
    (*ptls_clear_memory)(local_238,0x40);
    return iVar18;
  default:
    goto switchD_00117309_caseD_8;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar4 == '\x18') {
      message_00.base = puVar23;
      iVar18 = handle_key_update(tls,emitter_00,message_00);
      return iVar18;
    }
    if (cVar4 != '\x04') {
      return 10;
    }
    puVar39 = (uint8_t *)((long)&emitter_00->buf + 4);
    iVar18 = decode_new_session_ticket
                       (tls,(uint32_t *)&local_2a8,&local_23c,&local_260,(ptls_iovec_t *)local_238,
                        &local_240,puVar39,(uint8_t *)((long)&emitter_00->buf + (long)puVar23));
    if (iVar18 != 0) {
      return iVar18;
    }
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      return 0;
    }
    local_2a8.off = 0;
    local_2a8.capacity = 0x200;
    local_2a8.base = (uint8_t *)local_238;
    local_2a8.is_allocated = 0;
    psVar6 = tls->ctx->get_time;
    uVar20 = (*psVar6->cb)(psVar6);
    iVar18 = ptls_buffer_reserve(&local_2a8,8);
    puVar21 = local_2a8.base;
    sVar30 = local_2a8.off;
    if (iVar18 == 0) {
      *(uint64_t *)(local_2a8.base + local_2a8.off) =
           uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18
           | (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18
           | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
      local_2a8.off = local_2a8.off + 8;
      uVar17 = tls->key_share->id;
      iVar18 = ptls_buffer_reserve(&local_2a8,2);
      puVar21 = local_2a8.base;
      sVar30 = local_2a8.off;
      if (iVar18 == 0) {
        *(ushort *)(local_2a8.base + local_2a8.off) = uVar17 << 8 | uVar17 >> 8;
        local_2a8.off = local_2a8.off + 2;
        uVar17 = tls->cipher_suite->id;
        iVar18 = ptls_buffer_reserve(&local_2a8,2);
        puVar21 = local_2a8.base;
        sVar30 = local_2a8.off;
        if (iVar18 == 0) {
          *(ushort *)(local_2a8.base + local_2a8.off) = uVar17 << 8 | uVar17 >> 8;
          local_2a8.off = local_2a8.off + 2;
          iVar18 = ptls_buffer_reserve(&local_2a8,3);
          sVar9 = local_2a8.off;
          puVar21 = local_2a8.base;
          sVar30 = local_2a8.off;
          if (iVar18 == 0) {
            local_2a8.base[local_2a8.off + 2] = '\0';
            (local_2a8.base + local_2a8.off)[0] = '\0';
            (local_2a8.base + local_2a8.off)[1] = '\0';
            sVar37 = local_2a8.off + 3;
            local_2a8.off = sVar37;
            iVar18 = ptls_buffer__do_pushv(&local_2a8,puVar39,(size_t)(puVar23 + -4));
            auVar41 = _DAT_00129f50;
            auVar40 = _DAT_00129f40;
            puVar21 = local_2a8.base;
            sVar30 = local_2a8.off;
            if (iVar18 == 0) {
              uVar27 = local_2a8.off - sVar37;
              bVar15 = 0x10;
              lVar33 = 0;
              do {
                auVar42._8_4_ = (int)lVar33;
                auVar42._0_8_ = lVar33;
                auVar42._12_4_ = (int)((ulong)lVar33 >> 0x20);
                auVar42 = (auVar42 | auVar40) ^ auVar41;
                if (auVar42._4_4_ == -0x80000000 && auVar42._0_4_ < -0x7ffffffd) {
                  local_2a8.base[lVar33 + sVar9] = (uint8_t)(uVar27 >> (bVar15 & 0x3f));
                  local_2a8.base[lVar33 + sVar9 + 1] = (uint8_t)(uVar27 >> (bVar15 - 8 & 0x3f));
                }
                lVar33 = lVar33 + 2;
                bVar15 = bVar15 - 0x10;
              } while (lVar33 != 4);
              iVar18 = ptls_buffer_reserve(&local_2a8,2);
              sVar9 = local_2a8.off;
              puVar21 = local_2a8.base;
              sVar30 = local_2a8.off;
              if (iVar18 == 0) {
                (local_2a8.base + local_2a8.off)[0] = '\0';
                (local_2a8.base + local_2a8.off)[1] = '\0';
                sVar37 = local_2a8.off + 2;
                local_2a8.off = sVar37;
                iVar18 = ptls_buffer_reserve(&local_2a8,
                                             (tls->key_schedule->hashes[0].algo)->digest_size);
                sVar30 = local_2a8.off;
                puVar21 = local_2a8.base;
                if ((iVar18 == 0) &&
                   (nonce.len = local_260.len, nonce.base = local_260.base,
                   iVar18 = derive_resumption_secret
                                      (tls->key_schedule,local_2a8.base + local_2a8.off,nonce),
                   iVar18 == 0)) {
                  sVar30 = sVar30 + (tls->key_schedule->hashes[0].algo)->digest_size;
                  uVar17 = (short)sVar30 - (short)sVar37;
                  *(ushort *)(puVar21 + sVar9) = uVar17 * 0x100 | uVar17 >> 8;
                  psVar10 = tls->ctx->save_ticket;
                  pVar48.len = sVar30;
                  pVar48.base = puVar21;
                  iVar18 = (*psVar10->cb)(psVar10,tls,pVar48);
                }
              }
            }
          }
        }
      }
    }
    (*ptls_clear_memory)(puVar21,sVar30);
    if (local_2a8.is_allocated == 0) {
      return iVar18;
    }
    goto LAB_00117b09;
  }
  psVar8 = tls->ctx->decompress_certificate;
  if (psVar8 == (st_ptls_decompress_certificate_t *)0x0) {
    iVar18 = 10;
  }
  else {
    iVar18 = 0x32;
    iVar19 = 0x32;
    if ((5 < (long)puVar23) && ((uint8_t *)0x8 < puVar23)) {
      uVar24 = (uint)*(byte *)&emitter_00->enc |
               (uint)*(byte *)((long)&emitter_00->buf + 7) << 8 |
               (uint)*(byte *)((long)&emitter_00->buf + 6) << 0x10;
      if (uVar24 < 0x10001) {
        uVar17 = *(ushort *)((long)&emitter_00->buf + 4);
        puVar21 = (uint8_t *)malloc((ulong)uVar24);
        if (puVar21 != (uint8_t *)0x0) {
          iVar18 = iVar19;
          if ((uint8_t *)0x2 < puVar23 + -9) {
            lVar33 = 9;
            puVar39 = (uint8_t *)0x0;
            do {
              puVar39 = (uint8_t *)
                        ((ulong)*(byte *)((long)&emitter_00->buf + lVar33) | (long)puVar39 << 8);
              lVar33 = lVar33 + 1;
            } while (lVar33 != 0xc);
            if (puVar39 <= puVar23 + -0xc) {
              puVar32 = (uint8_t *)((long)&emitter_00->enc + 4);
              local_238._8_8_ = puVar39;
              local_238._0_8_ = puVar32;
              pVar14.len = (size_t)puVar39;
              pVar14.base = puVar32;
              pVar43.len._0_4_ = uVar24;
              pVar43.base = puVar21;
              pVar43.len._4_4_ = 0;
              iVar18 = (*psVar8->cb)(psVar8,tls,uVar17 << 8 | uVar17 >> 8,pVar43,pVar14);
              if ((iVar18 == 0) &&
                 (iVar18 = iVar19,
                 puVar32 + (long)puVar39 == (uint8_t *)((long)&emitter_00->buf + (long)puVar23))) {
                iVar19 = handle_certificate(tls,puVar21,puVar21 + uVar24,(int *)&local_2a8);
                iVar18 = 0x2f;
                if ((int)local_2a8.base != 0) {
                  iVar18 = 0;
                }
                if (iVar19 != 0) {
                  iVar18 = iVar19;
                }
                if (iVar18 == 0) {
                  ppVar29 = tls->key_schedule;
                  if (ppVar29->num_hashes != 0) {
                    pppVar35 = &ppVar29->hashes[0].ctx;
                    sVar30 = 0;
                    do {
                      (*(*pppVar35)->update)(*pppVar35,emitter_00,(size_t)puVar23);
                      sVar30 = sVar30 + 1;
                      pppVar35 = pppVar35 + 2;
                    } while (sVar30 != ppVar29->num_hashes);
                  }
                  tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                  iVar18 = 0x202;
                }
              }
            }
          }
          goto LAB_00117b09;
        }
        iVar18 = 0x201;
      }
      else {
        iVar18 = 0x2a;
      }
    }
  }
  puVar21 = (uint8_t *)0x0;
  goto LAB_00117b09;
LAB_001183f4:
  puVar39 = local_248;
  if (puVar32 == local_248) {
    local_1f8[0].len = local_268;
    iVar18 = 0x32;
    if (local_248 != puVar21) goto LAB_00117450;
    lVar33 = 0;
    goto LAB_0011882a;
  }
  if ((long)local_248 - (long)puVar32 < 2) goto LAB_0011834a;
  uVar5 = *puVar32;
  bVar15 = puVar32[1];
  uVar17 = CONCAT11(uVar5,bVar15);
  if (uVar17 < 0x40) {
    if ((*(byte *)((long)&local_260.base + (ulong)(uVar17 >> 3)) >> (uVar17 & 7) & 1) != 0)
    goto LAB_0011744a;
    pbVar3 = (byte *)((long)&local_260.base + (ulong)(bVar15 >> 3));
    *pbVar3 = *pbVar3 | '\x01' << (bVar15 & 7);
  }
  if ((ulong)((long)puVar39 - (long)(puVar32 + 2)) < 2) goto LAB_0011834a;
  uVar17 = *(ushort *)(puVar32 + 2) << 8 | *(ushort *)(puVar32 + 2) >> 8;
  pVar47.base = puVar32 + 4;
  if ((ulong)((long)puVar39 - (long)pVar47.base) < (ulong)uVar17) goto LAB_0011834a;
  psVar7 = tls->ctx->on_extension;
  uVar38 = CONCAT11(uVar5,bVar15);
  if ((psVar7 != (st_ptls_on_extension_t *)0x0) &&
     (pVar47.len._0_2_ = uVar17, pVar47.len._2_6_ = 0, local_278 = pVar47.base,
     iVar18 = (*psVar7->cb)(psVar7,tls,'\x02',uVar38,pVar47), pVar47.base = local_278, iVar18 != 0))
  {
    iVar18 = 1;
    goto LAB_00117450;
  }
  pVar47.base = pVar47.base + uVar17;
  puVar39 = pVar47.base;
  if (uVar38 < 0x2c) {
    if (uVar38 == 0x29) {
      if (!bVar28) goto LAB_0011744a;
      if (uVar17 < 2) goto LAB_0011834a;
      local_2d2 = *(ushort *)(puVar32 + 4) << 8 | *(ushort *)(puVar32 + 4) >> 8;
    }
    else {
      if (uVar38 != 0x2b) goto LAB_0011868f;
      if (uVar17 < 2) goto LAB_0011834a;
      local_2ba = *(ushort *)(puVar32 + 4) << 8 | *(ushort *)(puVar32 + 4) >> 8;
    }
LAB_0011868b:
    puVar39 = puVar32 + 6;
  }
  else if (uVar38 == 0x2c) {
    if (bVar28) goto LAB_0011744a;
    if (uVar17 < 2) goto LAB_0011834a;
    uVar27 = (ulong)(ushort)(*(ushort *)(puVar32 + 4) << 8 | *(ushort *)(puVar32 + 4) >> 8);
    puVar32 = puVar32 + 6;
    if (((ulong)((long)pVar47.base - (long)puVar32) <= uVar27 - 1) ||
       (local_280 = puVar32, local_268 = uVar27, local_1f8[0].base = puVar32,
       puVar32 + uVar27 != pVar47.base)) goto LAB_0011834a;
  }
  else if (uVar38 == 0x33) {
    if (!bVar28) {
      if (1 < uVar17) {
        uVar17 = *(ushort *)(puVar32 + 4) << 8 | *(ushort *)(puVar32 + 4) >> 8;
        local_2b8 = (uint8_t *)(ulong)uVar17;
        puStack_200._0_2_ = uVar17;
        goto LAB_0011868b;
      }
      goto LAB_0011834a;
    }
    if ((uVar17 < 2) || (pVar47.base + (-6 - (long)puVar32) < (uint8_t *)0x2)) goto LAB_0011834a;
    local_2b8 = puVar32 + 8;
    puVar34 = (uint8_t *)
              (ulong)(ushort)(*(ushort *)(puVar32 + 6) << 8 | *(ushort *)(puVar32 + 6) >> 8);
    if (pVar47.base + -(long)local_2b8 < puVar34) goto LAB_0011834a;
    puStack_200 = local_2b8;
    local_280 = puVar34;
    local_1f8[0].base = puVar34;
    if (local_2b8 + (long)puVar34 != pVar47.base) goto LAB_0011834a;
    iVar18 = 0x2f;
    if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) ||
       (tls->key_share->id !=
        (uint16_t)(*(ushort *)(puVar32 + 4) << 8 | *(ushort *)(puVar32 + 4) >> 8)))
    goto LAB_00117450;
  }
LAB_0011868f:
  puVar32 = pVar47.base;
  if (puVar39 != pVar47.base) goto LAB_0011834a;
  goto LAB_001183f4;
LAB_0011882a:
  if (*(ushort *)((long)supported_versions + lVar33) != local_2ba) goto code_r0x00118830;
  if (bVar28) {
    if (local_2d2 != 0xffff) {
      if ((local_2d2 != 0) || (((tls->field_18).server.pending_traffic_secret[0x38] & 1) == 0))
      goto LAB_0011744a;
      tls->field_0x160 = tls->field_0x160 | 2;
    }
    local_2b8._0_2_ = local_208._8_2_;
    if ((puStack_200 == (uint8_t *)0x0) && ((tls->field_0x160 & 2) == 0)) goto LAB_0011744a;
  }
  if ((uint8_t *)(tls->field_18).client.legacy_session_id.len == local_270) {
    iVar19 = (*ptls_mem_equal)(local_250,(tls->field_18).client.legacy_session_id.base,
                               (size_t)local_270);
    iVar18 = 0x2f;
    if (iVar19 != 0) {
      uVar24 = 0;
      if (bVar28) {
        if (((tls->field_18).server.pending_traffic_secret[0x38] & 1) != 0) {
          uVar24 = (uint)((tls->field_0x160 & 2) == 0);
        }
        iVar18 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar24);
        if ((iVar18 == 0) &&
           ((puStack_200 == (uint8_t *)0x0 ||
            (pVar44.len = (size_t)local_280, pVar44.base = puStack_200,
            iVar18 = (*((tls->field_18).client.key_share_ctx)->on_exchange)
                               (&(tls->field_18).client.key_share_ctx,1,(ptls_iovec_t *)&local_2a8,
                                pVar44), iVar18 == 0)))) {
          ppVar29 = tls->key_schedule;
          if (ppVar29->num_hashes != 0) {
            pppVar35 = &ppVar29->hashes[0].ctx;
            sVar30 = 0;
            do {
              (*(*pppVar35)->update)(*pppVar35,emitter_00,(size_t)puVar23);
              sVar30 = sVar30 + 1;
              pppVar35 = pppVar35 + 2;
            } while (sVar30 != ppVar29->num_hashes);
            ppVar29 = tls->key_schedule;
          }
          iVar18 = key_schedule_extract(ppVar29,(ptls_iovec_t)local_2a8._0_16_);
          if ((iVar18 == 0) &&
             (iVar18 = setup_traffic_protection(tls,0,"s hs traffic",2,0), iVar18 == 0)) {
            if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
              iVar18 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_001189d6:
              if (iVar18 == 0) {
LAB_001189da:
                tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                iVar18 = 0x202;
              }
            }
            else {
              puVar23 = (uint8_t *)malloc(0x40);
              tls->pending_handshake_secret = puVar23;
              if (puVar23 == (uint8_t *)0x0) {
                iVar18 = 0x201;
              }
              else {
                iVar18 = derive_secret(tls->key_schedule,puVar23,"c hs traffic");
                if (iVar18 == 0) {
                  psVar13 = tls->ctx->update_traffic_key;
                  if (psVar13 != (st_ptls_update_traffic_key_t *)0x0) {
                    iVar18 = (*psVar13->cb)(psVar13,tls,1,2,tls->pending_handshake_secret);
                    goto LAB_001189d6;
                  }
                  goto LAB_001189da;
                }
              }
            }
          }
        }
      }
      else {
        iVar18 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
        if (iVar18 == 0) {
          ppVar11 = (tls->field_18).client.key_share_ctx;
          if (ppVar11 != (ptls_key_exchange_context_t *)0x0) {
            pppVar1 = &(tls->field_18).client.key_share_ctx;
            (*ppVar11->on_exchange)(pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
            *pppVar1 = (ptls_key_exchange_context_t *)0x0;
          }
          bVar15 = (tls->field_18).server.pending_traffic_secret[0x38];
          if ((bVar15 & 2) != 0) {
            if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
              __ptr = (tls->traffic_protection).enc.aead;
              if (__ptr == (st_ptls_aead_context_t *)0x0) {
                __assert_fail("tls->traffic_protection.enc.aead != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                              ,0x8f3,
                              "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                             );
              }
              (*__ptr->dispose_crypto)(__ptr);
              (*ptls_clear_memory)(__ptr->static_iv,__ptr->algo->iv_size);
              free(__ptr);
              (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
              bVar15 = (tls->field_18).server.pending_traffic_secret[0x38];
            }
            (tls->field_18).server.pending_traffic_secret[0x38] = bVar15 & 0xfd;
          }
          if ((uint16_t)local_2b8 == 0xffff) {
            if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
              return 0x2f;
            }
          }
          else {
            pppVar22 = tls->ctx->key_exchanges;
            ppVar12 = *pppVar22;
            while( true ) {
              if (ppVar12 == (ptls_key_exchange_algorithm_t *)0x0) {
                return 0x2f;
              }
              pppVar22 = pppVar22 + 1;
              if (ppVar12->id == (uint16_t)local_2b8) break;
              ppVar12 = *pppVar22;
            }
            tls->key_share = ppVar12;
          }
          key_schedule_transform_post_ch1hash(tls->key_schedule);
          ppVar29 = tls->key_schedule;
          if (ppVar29->num_hashes != 0) {
            pppVar35 = &ppVar29->hashes[0].ctx;
            sVar30 = 0;
            do {
              (*(*pppVar35)->update)(*pppVar35,emitter_00,(size_t)puVar23);
              sVar30 = sVar30 + 1;
              pppVar35 = pppVar35 + 2;
            } while (sVar30 != ppVar29->num_hashes);
          }
          iVar18 = send_client_hello(tls,emitter,properties,local_1f8);
          return iVar18;
        }
      }
    }
    goto LAB_00117450;
  }
  goto LAB_0011744a;
code_r0x00118830:
  lVar33 = lVar33 + 2;
  if (lVar33 == 8) goto LAB_0011744a;
  goto LAB_0011882a;
LAB_0011834a:
  iVar18 = 0x32;
LAB_00117450:
  if (local_2a8.base == (uint8_t *)0x0) {
    return iVar18;
  }
  (*ptls_clear_memory)(local_2a8.base,local_2a8.capacity);
  puVar21 = local_2a8.base;
LAB_00117b09:
  free(puVar21);
  return iVar18;
}

Assistant:

static int handle_client_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}